

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

EventRegistry * __thiscall
license::LicenseReader::readLicenses
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,string *product,
          vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
          *licenseInfoOut)

{
  size_t *psVar1;
  bool bVar2;
  FUNCTION_RETURN FVar3;
  SI_Error SVar4;
  int iVar5;
  char *a_pSection;
  reference this_00;
  pointer pLVar6;
  size_type sVar7;
  char *pcVar8;
  size_t a_uDataLen;
  reference pbVar9;
  long lVar10;
  char *pcVar11;
  mapped_type *this_01;
  allocator local_2b1;
  key_type local_2b0;
  reference local_290;
  Entry *it_1;
  iterator __end4;
  iterator __begin4;
  TNamesDepend *__range4;
  string local_268;
  undefined1 local_248 [8];
  FullLicenseInfo licInfo;
  TNamesDepend keys;
  long license_version;
  char *license_signature;
  int sectionSize;
  SI_Error rc;
  string local_158 [8];
  string license;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  iterator it;
  CSimpleIniA ini;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseLocations;
  unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
  *locator;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  *__range1;
  char *productNamePtr;
  string product_up;
  bool atLeastOneLicenseComplete;
  undefined1 local_40 [4];
  FUNCTION_RETURN ret;
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  locator_strategies;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *licenseInfoOut_local;
  string *product_local;
  LicenseReader *this_local;
  EventRegistry *eventRegistry;
  
  locator_strategies.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)licenseInfoOut;
  std::
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ::vector((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
            *)local_40);
  FVar3 = locate::LocatorFactory::get_active_strategies
                    ((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                      *)local_40,this->licenseLocation);
  EventRegistry::EventRegistry(__return_storage_ptr__);
  if (FVar3 == FUNC_RET_OK) {
    product_up.field_2._M_local_buf[0xb] = '\0';
    toupper_copy((string *)&productNamePtr,product);
    a_pSection = (char *)std::__cxx11::string::c_str();
    __end1 = std::
             vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
             ::begin((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                      *)local_40);
    locator = (unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
               *)std::
                 vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                 ::end((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                        *)local_40);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_*,_std::vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>_>
                                       *)&locator), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_*,_std::vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>_>
                ::operator*(&__end1);
      pLVar6 = std::
               unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
               ::operator->(this_00);
      (*pLVar6->_vptr_LocatorStrategy[1])(&ini.m_bStoreIsUtf8,pLVar6,__return_storage_ptr__);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ini.m_bStoreIsUtf8);
      if (sVar7 == 0) {
        product_up.field_2._12_4_ = 3;
      }
      else {
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
                  ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it,false,
                   false,false);
        local_130._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ini.m_bStoreIsUtf8);
        while( true ) {
          license.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ini.m_bStoreIsUtf8);
          bVar2 = __gnu_cxx::operator!=
                            (&local_130,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&license.field_2 + 8));
          if (!bVar2) break;
          CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset
                    ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it);
          pLVar6 = std::
                   unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                   ::operator->(this_00);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_130);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&rc,pcVar8,(allocator *)((long)&sectionSize + 3));
          (*pLVar6->_vptr_LocatorStrategy[2])(local_158,pLVar6,&rc);
          std::__cxx11::string::~string((string *)&rc);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sectionSize + 3));
          pcVar8 = (char *)std::__cxx11::string::c_str();
          a_uDataLen = std::__cxx11::string::size();
          SVar4 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
                            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                             &it,pcVar8,a_uDataLen);
          if (SVar4 < SI_OK) {
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_130);
            EventRegistry::addEvent(__return_storage_ptr__,FILE_FORMAT_NOT_RECOGNIZED,pbVar9);
            product_up.field_2._12_4_ = 6;
          }
          else {
            iVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                    GetSectionSize((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                    *)&it,a_pSection);
            if (iVar5 < 1) {
              pbVar9 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_130);
              EventRegistry::addEvent(__return_storage_ptr__,PARALLELS,pbVar9);
              product_up.field_2._12_4_ = 6;
            }
            else {
              pbVar9 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_130);
              EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_FOUND,pbVar9);
              pcVar8 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                   *)&it,a_pSection,"sig",(char *)0x0,(bool *)0x0);
              lVar10 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                       GetLongValue((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                     *)&it,a_pSection,"lic_ver",-1,(bool *)0x0);
              if ((pcVar8 == (char *)0x0) || (lVar10 != 200)) {
                pbVar9 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_130);
                EventRegistry::addEvent(__return_storage_ptr__,HV,pbVar9);
              }
              else {
                psVar1 = &licInfo.m_limits._M_t._M_impl.super__Rb_tree_header._M_node_count;
                std::__cxx11::
                list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ::list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                        *)psVar1);
                CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllKeys
                          ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it,
                           a_pSection,(TNamesDepend *)psVar1);
                pbVar9 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_130);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_268,pcVar8,(allocator *)((long)&__range4 + 7));
                FullLicenseInfo::FullLicenseInfo
                          ((FullLicenseInfo *)local_248,pbVar9,product,&local_268);
                std::__cxx11::string::~string((string *)&local_268);
                std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
                psVar1 = &licInfo.m_limits._M_t._M_impl.super__Rb_tree_header._M_node_count;
                __end4 = std::__cxx11::
                         list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                         ::begin((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                                  *)psVar1);
                it_1 = (Entry *)std::__cxx11::
                                list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                                ::end((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                                       *)psVar1);
                while (bVar2 = std::operator!=(&__end4,(_Self *)&it_1), bVar2) {
                  local_290 = std::
                              _List_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                              ::operator*(&__end4);
                  pcVar11 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                            GetValue((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                      *)&it,a_pSection,local_290->pItem,(char *)0x0,(bool *)0x0);
                  pcVar8 = local_290->pItem;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_2b0,pcVar8,&local_2b1);
                  this_01 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&licInfo.m_magic,&local_2b0);
                  std::__cxx11::string::operator=((string *)this_01,pcVar11);
                  std::__cxx11::string::~string((string *)&local_2b0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                  std::
                  _List_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                  ::operator++(&__end4);
                }
                std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                push_back((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                           *)locator_strategies.
                             super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)local_248);
                product_up.field_2._M_local_buf[0xb] = '\x01';
                FullLicenseInfo::~FullLicenseInfo((FullLicenseInfo *)local_248);
                std::__cxx11::
                list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ::~list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                         *)&licInfo.m_limits._M_t._M_impl.super__Rb_tree_header._M_node_count);
              }
              product_up.field_2._12_4_ = 0;
            }
          }
          std::__cxx11::string::~string(local_158);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_130,0);
        }
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                  ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it);
        product_up.field_2._12_4_ = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ini.m_bStoreIsUtf8);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_*,_std::vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>_>
      ::operator++(&__end1);
    }
    if ((product_up.field_2._M_local_buf[0xb] & 1U) == 0) {
      EventRegistry::turnWarningsIntoErrors(__return_storage_ptr__);
    }
    product_up.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&productNamePtr);
  }
  else {
    EventRegistry::addEvent(__return_storage_ptr__,IFF_UP,(char *)0x0,(char *)0x0);
    EventRegistry::turnWarningsIntoErrors(__return_storage_ptr__);
    product_up.field_2._12_4_ = 1;
  }
  std::
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ::~vector((vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::readLicenses(const string &product, vector<FullLicenseInfo> &licenseInfoOut) const {
	vector<unique_ptr<locate::LocatorStrategy>> locator_strategies;
	FUNCTION_RETURN ret = locate::LocatorFactory::get_active_strategies(locator_strategies, licenseLocation);
	EventRegistry eventRegistry;
	if (ret != FUNC_RET_OK) {
		eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND);
		eventRegistry.turnWarningsIntoErrors();
		return eventRegistry;
	}

	bool atLeastOneLicenseComplete = false;
	const string product_up = toupper_copy(product);
	const char *productNamePtr = product_up.c_str();
	for (unique_ptr<locate::LocatorStrategy> &locator : locator_strategies) {
		vector<string> licenseLocations = locator->license_locations(eventRegistry);
		if (licenseLocations.size() == 0) {
			continue;
		}
		CSimpleIniA ini;
		for (auto it = licenseLocations.begin(); it != licenseLocations.end(); it++) {
			ini.Reset();
			const string license = locator->retrieve_license_content((*it).c_str());
			const SI_Error rc = ini.LoadData(license.c_str(), license.size());
			if (rc < 0) {
				eventRegistry.addEvent(FILE_FORMAT_NOT_RECOGNIZED, *it);
				continue;
			}
			const int sectionSize = ini.GetSectionSize(productNamePtr);
			if (sectionSize <= 0) {
				eventRegistry.addEvent(PRODUCT_NOT_LICENSED, *it);
				continue;
			} else {
				eventRegistry.addEvent(PRODUCT_FOUND, *it);
			}
			/*
			 *  sw_version_from = (optional int)
			 *  sw_version_to = (optional int)
			 *  from_date = YYYY-MM-DD (optional)
			 *  to_date  = YYYY-MM-DD (optional)
			 *  client_signature = XXXX-XXXX-XXXX (optional string 16)
			 *  sig = XXXXXXXXXX (mandatory, 1024)
			 *  application_data = xxxxxxxxx (optional string 16)
			 */
			const char *license_signature = ini.GetValue(productNamePtr, LICENSE_SIGNATURE, nullptr);
			long license_version = ini.GetLongValue(productNamePtr, LICENSE_VERSION, -1);
			if (license_signature != nullptr && license_version == 200) {
				CSimpleIniA::TNamesDepend keys;
				ini.GetAllKeys(productNamePtr, keys);
				FullLicenseInfo licInfo(*it, product, license_signature);
				for (auto &it : keys) {
					licInfo.m_limits[it.pItem] = ini.GetValue(productNamePtr, it.pItem, nullptr);
				}
				licenseInfoOut.push_back(licInfo);
				atLeastOneLicenseComplete = true;
			} else {
				eventRegistry.addEvent(LICENSE_MALFORMED, *it);
			}
		}
	}
	if (!atLeastOneLicenseComplete) {
		eventRegistry.turnWarningsIntoErrors();
	}
	return eventRegistry;
}